

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

double perfetto::base::StrToD(char *nptr,char **endptr)

{
  int iVar1;
  double dVar2;
  char **endptr_local;
  char *nptr_local;
  
  if (StrToD(char_const*,char**)::c_locale == '\0') {
    iVar1 = __cxa_guard_acquire(&StrToD(char_const*,char**)::c_locale);
    if (iVar1 != 0) {
      StrToD::c_locale = (locale_t)newlocale(6,"C",(__locale_t)0x0);
      __cxa_guard_release(&StrToD(char_const*,char**)::c_locale);
    }
  }
  dVar2 = strtod_l(nptr,endptr,(__locale_t)StrToD::c_locale);
  return dVar2;
}

Assistant:

double StrToD(const char* nptr, char** endptr) {
#if PERFETTO_BUILDFLAG(PERFETTO_OS_ANDROID) || \
    PERFETTO_BUILDFLAG(PERFETTO_OS_LINUX) ||   \
    PERFETTO_BUILDFLAG(PERFETTO_OS_APPLE)
  static auto c_locale = newlocale(LC_ALL, "C", nullptr);
  return strtod_l(nptr, endptr, c_locale);
#else
  return strtod(nptr, endptr);
#endif
}